

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_kpr_mri.c
# Opt level: O0

int Js(sunrealtype t,N_Vector y,N_Vector fy,SUNMatrix J,void *user_data,N_Vector tmp1,N_Vector tmp2,
      N_Vector tmp3)

{
  double dVar1;
  double dVar2;
  double dVar3;
  long *plVar4;
  double *in_RCX;
  int in_EDX;
  undefined4 in_register_00000014;
  void *in_RSI;
  long *in_RDI;
  int in_R8D;
  int in_R9D;
  double dVar5;
  double extraout_XMM0_Qa;
  double t_00;
  sunrealtype sVar6;
  sunrealtype v;
  sunrealtype u;
  sunrealtype e;
  sunrealtype G;
  sunrealtype *rpar;
  void *user_data_00;
  
  plVar4 = (long *)CONCAT44(in_register_00000014,in_EDX);
  user_data_00 = (void *)*in_RCX;
  dVar1 = in_RCX[2];
  dVar2 = **(double **)(*in_RDI + 0x10);
  dVar3 = *(double *)(*(long *)(*in_RDI + 0x10) + 8);
  dVar5 = (double)user_data_00 / 2.0;
  r(in_RCX,in_RSI,in_EDX,(char *)in_RCX,in_R8D,in_R9D);
  t_00 = extraout_XMM0_Qa + 1.0;
  sVar6 = rdot(t_00,user_data_00);
  *(double *)**(undefined8 **)(*plVar4 + 0x20) =
       dVar5 + ((double)user_data_00 * t_00 + -sVar6) / (dVar2 * 2.0 * dVar2);
  sVar6 = s(t_00,user_data_00);
  **(double **)(*(long *)(*plVar4 + 0x20) + 8) =
       dVar1 / 2.0 + (dVar1 * (sVar6 + 2.0)) / (dVar3 * 2.0 * dVar3);
  *(undefined8 *)(**(long **)(*plVar4 + 0x20) + 8) = 0;
  *(undefined8 *)(*(long *)(*(long *)(*plVar4 + 0x20) + 8) + 8) = 0;
  return 0;
}

Assistant:

static int Js(sunrealtype t, N_Vector y, N_Vector fy, SUNMatrix J,
              void* user_data, N_Vector tmp1, N_Vector tmp2, N_Vector tmp3)
{
  sunrealtype* rpar   = (sunrealtype*)user_data;
  const sunrealtype G = rpar[0];
  const sunrealtype e = rpar[2];
  const sunrealtype u = NV_Ith_S(y, 0);
  const sunrealtype v = NV_Ith_S(y, 1);

  /* fill in the Jacobian:
     [G/2 + (G*(1+r(t))-rdot(t))/(2*u^2)   e/2+e*(2+s(t))/(2*v^2)]
     [                 0                             0           ] */
  SM_ELEMENT_D(J, 0, 0) = G / TWO + (G * (ONE + r(t, rpar)) - rdot(t, rpar)) /
                                      (2 * u * u);
  SM_ELEMENT_D(J, 0, 1) = e / TWO + e * (TWO + s(t, rpar)) / (TWO * v * v);
  SM_ELEMENT_D(J, 1, 0) = ZERO;
  SM_ELEMENT_D(J, 1, 1) = ZERO;

  /* Return with success */
  return 0;
}